

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Oneof_Test::~DynamicMessageTest_Oneof_Test
          (DynamicMessageTest_Oneof_Test *this)

{
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__DynamicMessageTest_018eb948;
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.
  super_WithParamInterface<std::tuple<bool,_bool>_>._vptr_WithParamInterface =
       (_func_int **)&PTR__DynamicMessageTest_018eb988;
  DynamicMessageFactory::~DynamicMessageFactory(&(this->super_DynamicMessageTest).factory_);
  DescriptorPool::~DescriptorPool(&(this->super_DynamicMessageTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Oneof) {
  // Check that oneof fields work properly.
  Arena arena;
  Message* message = oneof_prototype_->New(use_arena() ? &arena : nullptr);

  // Check default values.
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* reflection = message->GetReflection();
  EXPECT_EQ(0, reflection->GetInt32(*message,
                                    descriptor->FindFieldByName("foo_int")));
  EXPECT_EQ("", reflection->GetString(
                    *message, descriptor->FindFieldByName("foo_string")));
  EXPECT_EQ("", reflection->GetString(*message,
                                      descriptor->FindFieldByName("foo_cord")));
  EXPECT_EQ("", reflection->GetString(
                    *message, descriptor->FindFieldByName("foo_string_piece")));
  EXPECT_EQ("", reflection->GetString(
                    *message, descriptor->FindFieldByName("foo_bytes")));
  EXPECT_EQ(
      use_editions_proto() ? +edition_unittest::TestOneof2::UNKNOWN
                           : +unittest::TestOneof2::FOO,
      reflection->GetEnum(*message, descriptor->FindFieldByName("foo_enum"))
          ->number());
  const Descriptor* nested_descriptor;
  const Message* nested_prototype;
  nested_descriptor = oneof_descriptor_->FindNestedTypeByName("NestedMessage");
  nested_prototype = factory_.GetPrototype(nested_descriptor);
  EXPECT_EQ(nested_prototype,
            &reflection->GetMessage(
                *message, descriptor->FindFieldByName("foo_message")));
  const Descriptor* foogroup_descriptor;
  const Message* foogroup_prototype;
  foogroup_descriptor = oneof_descriptor_->FindNestedTypeByName("FooGroup");
  foogroup_prototype = factory_.GetPrototype(foogroup_descriptor);
  EXPECT_EQ(foogroup_prototype,
            &reflection->GetMessage(*message,
                                    descriptor->FindFieldByName("foogroup")));
  EXPECT_NE(foogroup_prototype,
            &reflection->GetMessage(
                *message, descriptor->FindFieldByName("foo_lazy_message")));
  EXPECT_EQ(5, reflection->GetInt32(*message,
                                    descriptor->FindFieldByName("bar_int")));
  EXPECT_EQ("STRING", reflection->GetString(
                          *message, descriptor->FindFieldByName("bar_string")));
  EXPECT_EQ("CORD", reflection->GetString(
                        *message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_EQ("SPIECE",
            reflection->GetString(
                *message, descriptor->FindFieldByName("bar_string_piece")));
  EXPECT_EQ("BYTES", reflection->GetString(
                         *message, descriptor->FindFieldByName("bar_bytes")));
  EXPECT_EQ(
      unittest::TestOneof2::BAR,
      reflection->GetEnum(*message, descriptor->FindFieldByName("bar_enum"))
          ->number());

  // Check set functions.
  TestUtil::ReflectionTester reflection_tester(oneof_descriptor_);
  reflection_tester.SetOneofViaReflection(message);
  reflection_tester.ExpectOneofSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}